

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

int32 ngram_class_add_word(ngram_class_t *lmclass,int32 wid,int32 lweight)

{
  uint uVar1;
  uint uVar2;
  ngram_hash_s *pnVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ngram_hash_s *pnVar7;
  
  pnVar3 = lmclass->nword_hash;
  if (pnVar3 == (ngram_hash_s *)0x0) {
    pnVar3 = (ngram_hash_s *)
             __ckd_malloc__(0x600,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x2ce);
    lmclass->nword_hash = pnVar3;
    memset(pnVar3,0xff,0x600);
    lmclass->n_hash = 0x80;
    lmclass->n_hash_inuse = 0;
    pnVar3 = lmclass->nword_hash;
    uVar6 = 0x80;
  }
  else {
    uVar6 = lmclass->n_hash;
  }
  uVar2 = uVar6 - 1 & wid;
  if (pnVar3[(int)uVar2].wid == -1) {
    pnVar3[(int)uVar2].wid = wid;
    pnVar3[(int)uVar2].prob1 = lweight;
    uVar5 = lmclass->n_hash_inuse;
  }
  else {
    do {
      uVar1 = uVar2;
      uVar2 = pnVar3[(int)uVar1].next;
    } while (pnVar3[(int)uVar1].next != 0xffffffff);
    if (uVar1 == 0xffffffff) {
      __assert_fail("hash != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                    ,0x2e4,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
    }
    uVar5 = lmclass->n_hash_inuse;
    if (uVar5 == uVar6) {
      pnVar3 = (ngram_hash_s *)
               __ckd_realloc__(pnVar3,(long)(int)(uVar6 * 2) * 0xc,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                               ,0x2eb);
      lmclass->nword_hash = pnVar3;
      memset(pnVar3 + lmclass->n_hash,0xff,(long)lmclass->n_hash * 0xc);
      uVar2 = lmclass->n_hash;
      lmclass->n_hash = uVar2 * 2;
      pnVar3 = lmclass->nword_hash;
      uVar5 = lmclass->n_hash_inuse;
    }
    else {
      if (0 < (int)uVar6) {
        uVar4 = 0;
        pnVar7 = pnVar3;
        do {
          if (pnVar7->wid == -1) goto LAB_0013248b;
          uVar4 = uVar4 + 1;
          pnVar7 = pnVar7 + 1;
        } while (uVar6 != uVar4);
LAB_0013246a:
        __assert_fail("next != lmclass->n_hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                      ,0x2f8,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
      }
      uVar4 = 0;
LAB_0013248b:
      uVar2 = (uint)uVar4;
      if (uVar2 == uVar6) goto LAB_0013246a;
    }
    pnVar3[(int)uVar2].wid = wid;
    pnVar3[(int)uVar2].prob1 = lweight;
    pnVar3[(int)uVar1].next = uVar2;
  }
  lmclass->n_hash_inuse = uVar5 + 1;
  return uVar2;
}

Assistant:

int32
ngram_class_add_word(ngram_class_t * lmclass, int32 wid, int32 lweight)
{
    int32 hash;

    if (lmclass->nword_hash == NULL) {
        /* Initialize everything in it to -1 */
        lmclass->nword_hash =
            ckd_malloc(NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        memset(lmclass->nword_hash, 0xff,
               NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        lmclass->n_hash = NGRAM_HASH_SIZE;
        lmclass->n_hash_inuse = 0;
    }
    /* Stupidest possible hash function.  This will work pretty well
     * when this function is called repeatedly with contiguous word
     * IDs, though... */
    hash = wid & (lmclass->n_hash - 1);
    if (lmclass->nword_hash[hash].wid == -1) {
        /* Good, no collision. */
        lmclass->nword_hash[hash].wid = wid;
        lmclass->nword_hash[hash].prob1 = lweight;
        ++lmclass->n_hash_inuse;
        return hash;
    }
    else {
        int32 next; /**< Next available bucket. */
        /* Collision... Find the end of the hash chain. */
        while (lmclass->nword_hash[hash].next != -1)
            hash = lmclass->nword_hash[hash].next;
        assert(hash != -1);
        /* Does we has any more bukkit? */
        if (lmclass->n_hash_inuse == lmclass->n_hash) {
            /* Oh noes!  Ok, we makes more. */
            lmclass->nword_hash = ckd_realloc(lmclass->nword_hash,
                                              lmclass->n_hash * 2 *
                                              sizeof(*lmclass->
                                                     nword_hash));
            memset(lmclass->nword_hash + lmclass->n_hash, 0xff,
                   lmclass->n_hash * sizeof(*lmclass->nword_hash));
            /* Just use the next allocated one (easy) */
            next = lmclass->n_hash;
            lmclass->n_hash *= 2;
        }
        else {
            /* Look for any available bucket.  We hope this doesn't happen. */
            for (next = 0; next < lmclass->n_hash; ++next)
                if (lmclass->nword_hash[next].wid == -1)
                    break;
            /* This should absolutely not happen. */
            assert(next != lmclass->n_hash);
        }
        lmclass->nword_hash[next].wid = wid;
        lmclass->nword_hash[next].prob1 = lweight;
        lmclass->nword_hash[hash].next = next;
        ++lmclass->n_hash_inuse;
        return next;
    }
}